

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O1

void __thiscall OpenMD::RepulsivePower::calcForce(RepulsivePower *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer piVar5;
  double dVar6;
  uint i;
  long lVar7;
  long lVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  double local_58 [4];
  double local_38 [4];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar5 = (this->RPtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar5[idat->atid1]].
                    super__Vector_base<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar8 = (long)piVar5[idat->atid2] * 0x20;
  dVar1 = *(double *)(lVar7 + 8 + lVar8);
  dVar2 = *(double *)(lVar7 + 0x10 + lVar8);
  iVar4 = *(int *)(lVar7 + 0x18 + lVar8);
  __x = 1.0 / (idat->rij * dVar2);
  dVar6 = (double)iVar4;
  dVar9 = pow(__x,dVar6);
  dVar11 = (double)-iVar4;
  if (idat->shiftedPot == true) {
    dVar10 = pow(1.0 / (idat->rcut * dVar2),dVar6);
    dVar13 = 0.0;
  }
  else {
    dVar10 = 0.0;
    dVar13 = 0.0;
    if (idat->shiftedForce == true) {
      dVar13 = 1.0 / (idat->rcut * dVar2);
      dVar10 = pow(dVar13,dVar6);
      dVar13 = dVar13 * dVar10 * dVar11;
      dVar10 = (idat->rij - idat->rcut) * dVar13 * dVar2 + dVar10;
    }
  }
  dVar6 = idat->sw;
  dVar3 = idat->vdwMult;
  dVar12 = (dVar9 - dVar10) * dVar1 * dVar3;
  dVar10 = dVar6 * dVar12;
  idat->vpair = dVar12 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar10;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar10 + (idat->selePot).data_[1];
  }
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  lVar7 = 0;
  do {
    local_58[lVar7] =
         (idat->d).super_Vector<double,_3U>.data_[lVar7] *
         dVar2 * (__x * dVar9 * dVar11 - dVar13) * dVar1 * dVar3 * dVar6;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar1 = idat->rij;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar7 = 0;
  do {
    local_38[lVar7] = local_58[lVar7] / dVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar7] =
         local_38[lVar7] + (idat->f1).super_Vector<double,_3U>.data_[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return;
}

Assistant:

void RepulsivePower::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    RPInteractionData& mixer =
        MixingMap[RPtids[idat.atid1]][RPtids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getNRepulsionFunc(ros, nRep, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }